

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

vector<const_psy::C::SyntaxTree_*,_std::allocator<const_psy::C::SyntaxTree_*>_> * __thiscall
psy::C::Compilation::syntaxTrees
          (vector<const_psy::C::SyntaxTree_*,_std::allocator<const_psy::C::SyntaxTree_*>_>
           *__return_storage_ptr__,Compilation *this)

{
  __node_base _Var1;
  allocator_type local_21;
  SyntaxTree *local_20;
  
  std::vector<const_psy::C::SyntaxTree_*,_std::allocator<const_psy::C::SyntaxTree_*>_>::vector
            (__return_storage_ptr__,
             *(size_type *)
              ((long)&((this->impl_)._M_t.
                       super___uniq_ptr_impl<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_psy::C::Compilation::CompilationImpl_*,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
                       .super__Head_base<0UL,_psy::C::Compilation::CompilationImpl_*,_false>.
                      _M_head_impl)->semaModels_ + 0x18),&local_21);
  _Var1._M_nxt = ((__node_base *)
                 ((long)&((this->impl_)._M_t.
                          super___uniq_ptr_impl<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_psy::C::Compilation::CompilationImpl_*,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
                          .super__Head_base<0UL,_psy::C::Compilation::CompilationImpl_*,_false>.
                         _M_head_impl)->semaModels_ + 0x10))->_M_nxt;
  if (_Var1._M_nxt != (_Hash_node_base *)0x0) {
    do {
      local_20 = (SyntaxTree *)_Var1._M_nxt[1]._M_nxt;
      std::vector<psy::C::SyntaxTree_const*,std::allocator<psy::C::SyntaxTree_const*>>::
      emplace_back<psy::C::SyntaxTree_const*>
                ((vector<psy::C::SyntaxTree_const*,std::allocator<psy::C::SyntaxTree_const*>> *)
                 __return_storage_ptr__,&local_20);
      _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt;
    } while (_Var1._M_nxt != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const SyntaxTree*> Compilation::syntaxTrees() const
{
    std::vector<const SyntaxTree*> trees(P->semaModels_.size());
    std::transform(P->semaModels_.begin(),
                   P->semaModels_.end(),
                   std::back_inserter(trees),
                   [] (const auto& kv) { return kv.first; });
    return  trees;
}